

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sema.h
# Opt level: O0

bool __thiscall phaeton::Sema::is_in_inputs(Sema *this,string *Name)

{
  bool bVar1;
  Symbol *pSVar2;
  reference ppSVar3;
  Symbol *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_> *__range2;
  Symbol *Sym;
  string *Name_local;
  Sema *this_local;
  
  pSVar2 = getSymbol(this,Name);
  __end2 = std::vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>::begin
                     (&this->Inputs);
  s = (Symbol *)
      std::vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>::end
                (&this->Inputs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_phaeton::Symbol_*const_*,_std::vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>_>
                                *)&s);
    if (!bVar1) {
      return false;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<const_phaeton::Symbol_*const_*,_std::vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>_>
              ::operator*(&__end2);
    if (*ppSVar3 == pSVar2) break;
    __gnu_cxx::
    __normal_iterator<const_phaeton::Symbol_*const_*,_std::vector<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool is_in_inputs(const std::string &Name) const {
    const Symbol *Sym = getSymbol(Name);
    for (auto s : Inputs) {
      if (s == Sym)
        return true;
    }
    return false;
  }